

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandPASS(FtpSession *this,string *param)

{
  bool bVar1;
  shared_ptr<fineftp::FtpUser> user;
  allocator local_49;
  string local_48;
  undefined1 local_28 [16];
  
  bVar1 = ::std::operator!=(&this->last_command_,"USER");
  if (bVar1) {
    ::std::__cxx11::string::string
              ((string *)&local_48,"Please specify username first",(allocator *)local_28);
    sendFtpMessage(this,COMMANDS_BAD_SEQUENCE,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    UserDatabase::getUser
              ((UserDatabase *)local_28,(string *)this->user_database_,
               (string *)&this->username_for_login_);
    if (local_28._0_8_ == 0) {
      ::std::__cxx11::string::string((string *)&local_48,"Failed to log in",&local_49);
      sendFtpMessage(this,NOT_LOGGED_IN,&local_48);
    }
    else {
      std::__shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->logged_in_user_).
                  super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2> *)local_28);
      ::std::__cxx11::string::string((string *)&local_48,"Login successful",&local_49);
      sendFtpMessage(this,USER_LOGGED_IN,&local_48);
    }
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandPASS(const std::string& param)
  {
    if (last_command_ != "USER")
    {
      sendFtpMessage(FtpReplyCode::COMMANDS_BAD_SEQUENCE, "Please specify username first");
      return;
    }
    else
    {
      auto user = user_database_.getUser(username_for_login_, param);
      if (user)
      {
        logged_in_user_ = user;
        sendFtpMessage(FtpReplyCode::USER_LOGGED_IN, "Login successful");
        return;
      }
      else
      {
        sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN, "Failed to log in");
        return;
      }
    }
  }